

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O3

int lj_cf_package_loadlib(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *name;
  int iVar3;
  
  iVar3 = 1;
  pcVar2 = luaL_checklstring(L,1,(size_t *)0x0);
  name = luaL_checklstring(L,2,(size_t *)0x0);
  iVar1 = ll_loadfunc(L,pcVar2,name,1);
  if (iVar1 != 0) {
    lua_pushnil(L);
    lua_insert(L,-2);
    pcVar2 = "init";
    if (iVar1 == 1) {
      pcVar2 = "open";
    }
    lua_pushstring(L,pcVar2);
    iVar3 = 3;
  }
  return iVar3;
}

Assistant:

static int lj_cf_package_loadlib(lua_State *L)
{
  const char *path = luaL_checkstring(L, 1);
  const char *init = luaL_checkstring(L, 2);
  int st = ll_loadfunc(L, path, init, 1);
  if (st == 0) {  /* no errors? */
    return 1;  /* return the loaded function */
  } else {  /* error; error message is on stack top */
    lua_pushnil(L);
    lua_insert(L, -2);
    lua_pushstring(L, (st == PACKAGE_ERR_LIB) ?  PACKAGE_LIB_FAIL : "init");
    return 3;  /* return nil, error message, and where */
  }
}